

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectTracker.cpp
# Opt level: O2

void __thiscall
myvk::ObjectTracker::Track
          (ObjectTracker *this,Ptr<Fence> *fence,
          vector<std::shared_ptr<myvk::DeviceObjectBase>,_std::allocator<std::shared_ptr<myvk::DeviceObjectBase>_>_>
          *objects)

{
  pair<const_std::shared_ptr<myvk::Fence>,_std::vector<std::shared_ptr<myvk::DeviceObjectBase>,_std::allocator<std::shared_ptr<myvk::DeviceObjectBase>_>_>_>
  pStack_38;
  
  std::
  pair<const_std::shared_ptr<myvk::Fence>,_std::vector<std::shared_ptr<myvk::DeviceObjectBase>,_std::allocator<std::shared_ptr<myvk::DeviceObjectBase>_>_>_>
  ::
  pair<const_std::shared_ptr<myvk::Fence>,_std::vector<std::shared_ptr<myvk::DeviceObjectBase>,_std::allocator<std::shared_ptr<myvk::DeviceObjectBase>_>_>,_true>
            (&pStack_38,fence,objects);
  std::
  _Rb_tree<std::shared_ptr<myvk::Fence>,std::pair<std::shared_ptr<myvk::Fence>const,std::vector<std::shared_ptr<myvk::DeviceObjectBase>,std::allocator<std::shared_ptr<myvk::DeviceObjectBase>>>>,std::_Select1st<std::pair<std::shared_ptr<myvk::Fence>const,std::vector<std::shared_ptr<myvk::DeviceObjectBase>,std::allocator<std::shared_ptr<myvk::DeviceObjectBase>>>>>,std::less<std::shared_ptr<myvk::Fence>>,std::allocator<std::pair<std::shared_ptr<myvk::Fence>const,std::vector<std::shared_ptr<myvk::DeviceObjectBase>,std::allocator<std::shared_ptr<myvk::DeviceObjectBase>>>>>>
  ::
  _M_insert_equal<std::pair<std::shared_ptr<myvk::Fence>const,std::vector<std::shared_ptr<myvk::DeviceObjectBase>,std::allocator<std::shared_ptr<myvk::DeviceObjectBase>>>>>
            ((_Rb_tree<std::shared_ptr<myvk::Fence>,std::pair<std::shared_ptr<myvk::Fence>const,std::vector<std::shared_ptr<myvk::DeviceObjectBase>,std::allocator<std::shared_ptr<myvk::DeviceObjectBase>>>>,std::_Select1st<std::pair<std::shared_ptr<myvk::Fence>const,std::vector<std::shared_ptr<myvk::DeviceObjectBase>,std::allocator<std::shared_ptr<myvk::DeviceObjectBase>>>>>,std::less<std::shared_ptr<myvk::Fence>>,std::allocator<std::pair<std::shared_ptr<myvk::Fence>const,std::vector<std::shared_ptr<myvk::DeviceObjectBase>,std::allocator<std::shared_ptr<myvk::DeviceObjectBase>>>>>>
              *)this,&pStack_38);
  std::
  pair<const_std::shared_ptr<myvk::Fence>,_std::vector<std::shared_ptr<myvk::DeviceObjectBase>,_std::allocator<std::shared_ptr<myvk::DeviceObjectBase>_>_>_>
  ::~pair(&pStack_38);
  return;
}

Assistant:

void ObjectTracker::Track(const Ptr<Fence> &fence,
                          const std::vector<Ptr<DeviceObjectBase>> &objects) {
	m_tracker.insert({fence, objects});
}